

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmp.c
# Opt level: O1

_Bool pmp_hart_has_privs_riscv64
                (CPURISCVState_conflict2 *env,target_ulong addr,target_ulong size,pmp_priv_t privs,
                target_ulong mode)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  
  if ((env->pmp_state).num_rules == 0) {
    return true;
  }
  iVar3 = -((uint)addr | 0xfffff000);
  if (size != 0) {
    iVar3 = (int)size;
  }
  uVar4 = ((long)iVar3 + addr) - 1;
  uVar7 = 0xffffffff;
  lVar5 = -0xf0;
  do {
    uVar2 = *(ulong *)((long)&(env->pmp_state).addr[0xf].sa + lVar5);
    if ((addr < uVar2) ||
       (iVar3 = 1, *(ulong *)((long)&(env->pmp_state).addr[0xf].ea + lVar5) < addr)) {
      iVar3 = 0;
    }
    if ((uVar4 < uVar2) ||
       (iVar6 = 1, *(ulong *)((long)&(env->pmp_state).addr[0xf].ea + lVar5) < uVar4)) {
      iVar6 = 0;
    }
    iVar6 = iVar6 + iVar3;
    if (iVar6 == 1) {
      uVar7 = 0;
      break;
    }
    bVar1 = *(byte *)((long)(env->pmp_state).addr + lVar5 + -8);
    bVar8 = (bVar1 & 0x18) == 0;
    if (!bVar8 && iVar6 == 2) {
      if (((mode != 3) || ((char)bVar1 < '\0')) ||
         ((uVar7 = 7, lVar5 != 0 &&
          ((*(byte *)((long)&(env->pmp_state).addr[0].ea + lVar5) & 0x98) == 0x88)))) {
        uVar7 = bVar1 & 7;
      }
      uVar7 = (uint)((privs & ~uVar7) == 0);
    }
    bVar9 = lVar5 != 0;
    lVar5 = lVar5 + 0x10;
  } while ((bVar8 || iVar6 != 2) && bVar9);
  bVar8 = uVar7 == 1;
  if (uVar7 == 0xffffffff) {
    bVar8 = mode == 3;
  }
  return bVar8;
}

Assistant:

bool pmp_hart_has_privs(CPURISCVState *env, target_ulong addr,
    target_ulong size, pmp_priv_t privs, target_ulong mode)
{
    int i = 0;
    int ret = -1;
    int pmp_size = 0;
    target_ulong s = 0;
    target_ulong e = 0;
    pmp_priv_t allowed_privs = 0;

    /* Short cut if no rules */
    if (0 == pmp_get_num_rules(env)) {
        return true;
    }

    /*
     * if size is unknown (0), assume that all bytes
     * from addr to the end of the page will be accessed.
     */
    if (size == 0) {
#ifdef _MSC_VER
        pmp_size = 0 - (addr | TARGET_PAGE_MASK);
#else
        pmp_size = -(addr | TARGET_PAGE_MASK);
#endif
    } else {
        pmp_size = size;
    }

    /* 1.10 draft priv spec states there is an implicit order
         from low to high */
    for (i = 0; i < MAX_RISCV_PMPS; i++) {
        s = pmp_is_in_range(env, i, addr);
        e = pmp_is_in_range(env, i, addr + pmp_size - 1);

        /* partially inside */
        if ((s + e) == 1) {
            qemu_log_mask(LOG_GUEST_ERROR,
                          "pmp violation - access is partially inside\n");
            ret = 0;
            break;
        }

        /* fully inside */
        const uint8_t a_field =
            pmp_get_a_field(env->pmp_state.pmp[i].cfg_reg);

        /*
         * If the PMP entry is not off and the address is in range, do the priv
         * check
         */
        if (((s + e) == 2) && (PMP_AMATCH_OFF != a_field)) {
            allowed_privs = PMP_READ | PMP_WRITE | PMP_EXEC;
            if ((mode != PRV_M) || pmp_is_locked(env, i)) {
                allowed_privs &= env->pmp_state.pmp[i].cfg_reg;
            }

            if ((privs & allowed_privs) == privs) {
                ret = 1;
                break;
            } else {
                ret = 0;
                break;
            }
        }
    }

    /* No rule matched */
    if (ret == -1) {
        if (mode == PRV_M) {
            ret = 1; /* Privileged spec v1.10 states if no PMP entry matches an
                      * M-Mode access, the access succeeds */
        } else {
            ret = 0; /* Other modes are not allowed to succeed if they don't
                      * match a rule, but there are rules.  We've checked for
                      * no rule earlier in this function. */
        }
    }

    return ret == 1 ? true : false;
}